

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O0

void absl::lts_20250127::internal_statusor::Helper::Crash(Status *status)

{
  AlphaNum *in_RCX;
  string local_c0;
  AlphaNum local_a0;
  AlphaNum local_70;
  string local_40;
  int local_20 [2];
  char *local_18;
  char *absl_raw_log_internal_filename;
  Status *status_local;
  
  local_18 = 
  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/status/statusor.cc"
  ;
  local_20[1] = 3;
  local_20[0] = 0x59;
  absl_raw_log_internal_filename = (char *)status;
  AlphaNum::AlphaNum(&local_70,"Attempting to fetch value instead of handling error ");
  Status::ToString_abi_cxx11_(&local_c0,(Status *)absl_raw_log_internal_filename,kDefault);
  AlphaNum::AlphaNum<std::allocator<char>>(&local_a0,&local_c0);
  StrCat_abi_cxx11_(&local_40,(lts_20250127 *)&local_70,&local_a0,in_RCX);
  base_internal::
  AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
  operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
              *)raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_20 + 1),
             &local_18,local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_c0);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/status/statusor.cc"
                ,0x59,"static void absl::internal_statusor::Helper::Crash(const absl::Status &)");
}

Assistant:

void Helper::Crash(const absl::Status& status) {
  ABSL_INTERNAL_LOG(
      FATAL,
      absl::StrCat("Attempting to fetch value instead of handling error ",
                   status.ToString()));
}